

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecondaryOperationalData.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::SecondaryOperationalData::Encode
          (SecondaryOperationalData *this,KDataStream *stream)

{
  KDataStream::Write(stream,this->m_ui8Param1);
  KDataStream::Write(stream,this->m_ui8Param2);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumFundParamSets);
  return;
}

Assistant:

void SecondaryOperationalData::Encode( KDataStream & stream ) const
{
    stream << m_ui8Param1
           << m_ui8Param2
           << m_ui16NumFundParamSets;
}